

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

void __thiscall
glcts::ShaderStorageBufferLayoutBindingCase::teardownTest
          (ShaderStorageBufferLayoutBindingCase *this)

{
  Functions *pFVar1;
  ShaderStorageBufferLayoutBindingCase *this_local;
  
  pFVar1 = LayoutBindingBaseCase::gl(&this->super_LayoutBindingBaseCase);
  (*pFVar1->bindBuffer)(0x90d2,0);
  pFVar1 = LayoutBindingBaseCase::gl(&this->super_LayoutBindingBaseCase);
  (*pFVar1->deleteBuffers)(1,(GLuint *)&(this->super_LayoutBindingBaseCase).field_0x224);
  return;
}

Assistant:

void teardownTest(void)
	{
		gl().bindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		gl().deleteBuffers(1, &m_buffername);
	}